

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindGenericRoundFunctionDecimal<duckdb::TruncDecimalOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *pLVar1;
  Expression EVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  uchar uVar7;
  reference this_00;
  pointer pEVar8;
  reference pvVar9;
  code *__f;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  LogicalType local_60;
  undefined1 local_5f;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  pLVar1 = (LogicalType *)(pEVar8 + 0x38);
  cVar6 = duckdb::DecimalType::GetScale(pLVar1);
  uVar7 = duckdb::DecimalType::GetWidth(pLVar1);
  if (cVar6 == '\0') {
    __f = duckdb::ScalarFunction::NopFunction;
  }
  else {
    EVar2 = pEVar8[0x39];
    if (EVar2 == (Expression)0x9) {
      __f = GenericRoundFunctionDecimal<long,duckdb::NumericHelper,duckdb::TruncDecimalOperator>;
    }
    else if (EVar2 == (Expression)0x7) {
      __f = GenericRoundFunctionDecimal<int,duckdb::NumericHelper,duckdb::TruncDecimalOperator>;
    }
    else if (EVar2 == (Expression)0x5) {
      __f = GenericRoundFunctionDecimal<short,duckdb::NumericHelper,duckdb::TruncDecimalOperator>;
    }
    else {
      __f = 
      GenericRoundFunctionDecimal<duckdb::hugeint_t,duckdb::Hugeint,duckdb::TruncDecimalOperator>;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
  pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
  if (pvVar9 != pLVar1) {
    *pvVar9 = (value_type)pEVar8[0x38];
    *(Expression *)(pvVar9 + 1) = pEVar8[0x39];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar9 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar8 + 0x40));
  }
  duckdb::LogicalType::DECIMAL((uchar)&local_60,uVar7);
  uVar5 = uStack_50;
  uVar4 = local_58;
  bound_function->field_0x90 = local_60;
  bound_function->field_0x91 = local_5f;
  uVar10 = *(undefined4 *)&bound_function->field_0x98;
  uVar12 = *(undefined4 *)&bound_function->field_0xa0;
  *(undefined8 *)&bound_function->field_0x98 = 0;
  *(undefined8 *)&bound_function->field_0xa0 = 0;
  local_58 = 0;
  uStack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
  *(undefined8 *)&bound_function->field_0x98 = uVar4;
  *(undefined8 *)&bound_function->field_0xa0 = uVar5;
  uVar11 = *(undefined4 *)&bound_function->field_0x9c;
  uVar13 = *(undefined4 *)&bound_function->field_0xa4;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = uVar10;
    uStack_44 = *(undefined4 *)&bound_function->field_0x9c;
    uStack_40 = uVar12;
    uStack_3c = *(undefined4 *)&bound_function->field_0xa4;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    uVar10 = local_48;
    uVar11 = uStack_44;
    uVar12 = uStack_40;
    uVar13 = uStack_3c;
  }
  p_Var3 = uStack_50;
  local_58 = CONCAT44(uVar11,uVar10);
  uStack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar13,uVar12);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  duckdb::LogicalType::~LogicalType(&local_60);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}